

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_udp.c
# Opt level: O1

void csp_if_udp_init(csp_iface_t *iface,csp_if_udp_conf_t *ifconf)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  pthread_attr_t attributes;
  pthread_attr_t local_50;
  
  iface->driver_data = ifconf;
  iVar1 = inet_aton(ifconf->host,(in_addr *)&(ifconf->peer_addr).sin_addr);
  if (iVar1 == 0) {
    csp_print_func("  Unknown peer address %s\n",ifconf->host);
  }
  pcVar3 = inet_ntoa((in_addr)(ifconf->peer_addr).sin_addr.s_addr);
  csp_print_func("  UDP peer address: %s:%d (listening on port %d)\n",pcVar3,
                 (ulong)(uint)ifconf->rport,(ulong)(uint)ifconf->lport);
  uVar2 = pthread_attr_init(&local_50);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_init failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  uVar2 = pthread_attr_setdetachstate(&local_50,1);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_setdetachstate failed: %s: %d\n",pcVar3,
                   (ulong)uVar2);
  }
  uVar2 = pthread_create(&ifconf->server_handle,&local_50,csp_if_udp_rx_loop,iface);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_create failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  uVar2 = pthread_attr_destroy(&local_50);
  if (uVar2 != 0) {
    pcVar3 = strerror(uVar2);
    csp_print_func("csp_if_udp_init: pthread_attr_destroy failed: %s: %d\n",pcVar3,(ulong)uVar2);
  }
  iface->name = "UDP";
  iface->nexthop = csp_if_udp_tx;
  csp_iflist_add(iface);
  return;
}

Assistant:

void csp_if_udp_init(csp_iface_t * iface, csp_if_udp_conf_t * ifconf) {

	pthread_attr_t attributes;
	int ret;

	iface->driver_data = ifconf;

	if (inet_aton(ifconf->host, &ifconf->peer_addr.sin_addr) == 0) {
		csp_print("  Unknown peer address %s\n", ifconf->host);
	}

	csp_print("  UDP peer address: %s:%d (listening on port %d)\n", inet_ntoa(ifconf->peer_addr.sin_addr), ifconf->rport, ifconf->lport);

	/* Start server thread */
	ret = pthread_attr_init(&attributes);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_init failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_setdetachstate failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_create(&ifconf->server_handle, &attributes, csp_if_udp_rx_loop, iface);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_create failed: %s: %d\n", strerror(ret), ret);
	}
	ret = pthread_attr_destroy(&attributes);
	if (ret != 0) {
		csp_print("csp_if_udp_init: pthread_attr_destroy failed: %s: %d\n", strerror(ret), ret);
	}

	/* Register interface */
	iface->name = "UDP",
	iface->nexthop = csp_if_udp_tx,
	csp_iflist_add(iface);
}